

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_features.c
# Opt level: O3

void av1_set_speed_features_qindex_dependent(AV1_COMP *cpi,int speed)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  MODE MVar4;
  SEARCH_METHODS SVar5;
  AV1_PRIMARY *pAVar6;
  uint auVar7 [2];
  long lVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  code *pcVar13;
  undefined4 uVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  
  pAVar6 = cpi->ppi;
  bVar1 = cpi->gf_frame_index;
  bVar2 = (pAVar6->gf_group).update_type[bVar1];
  bVar3 = (cpi->common).current_frame.frame_type;
  bVar16 = (bVar3 & 0xfd) == 0;
  bVar17 = (bVar2 & 0xfe) == 2;
  iVar9 = (cpi->common).width;
  iVar12 = (cpi->common).height;
  if (iVar9 < iVar12) {
    iVar12 = iVar9;
  }
  MVar4 = (cpi->oxcf).mode;
  if (MVar4 == '\x01') {
    if (speed < 6) {
      return;
    }
    lVar8 = 0x6096c;
    if ((bVar3 & 0xfd) == 0) {
      uVar10 = 0;
    }
    else {
      iVar9 = 0x96;
      if (0x2cf < iVar12) {
        iVar9 = 0x78;
      }
      iVar12 = 0xbe;
      if ((bVar2 & 0xfe) != 2) {
        iVar12 = iVar9;
      }
      uVar10 = (uint)(iVar12 < (cpi->common).quant_params.base_qindex);
    }
    goto LAB_0022adbe;
  }
  if (speed == 0) {
    if (iVar12 < 0x2d0) {
      iVar9 = 0x8c;
      if (bVar2 == 6) {
        iVar9 = 0x6e;
      }
      iVar11 = 0x46;
      if (!bVar16 && !bVar17) {
        iVar11 = iVar9;
      }
      if ((cpi->common).quant_params.base_qindex <= iVar11) {
        (cpi->sf).part_sf.simple_motion_search_split =
             2 - (uint)(cpi->common).features.allow_screen_content_tools;
        (cpi->sf).part_sf.simple_motion_search_early_term_none = 1;
        uVar14 = 0;
        lVar8 = 0x60c08;
LAB_0022ab62:
        *(undefined4 *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar8) =
             uVar14;
      }
    }
    else {
      iVar9 = (cpi->common).quant_params.base_qindex;
      if (iVar9 < 0x81) {
        uVar10 = 0x437 < iVar12 | 2;
        (cpi->sf).rd_sf.perform_coeff_opt = uVar10;
        (cpi->winner_mode_params).coeff_opt_thresholds[2] = coeff_opt_thresholds[uVar10][2];
        auVar7 = coeff_opt_thresholds[uVar10][1];
        (cpi->winner_mode_params).coeff_opt_thresholds[0] = coeff_opt_thresholds[uVar10][0];
        (cpi->winner_mode_params).coeff_opt_thresholds[1] = auVar7;
        (cpi->sf).part_sf.simple_motion_search_split =
             2 - (uint)(cpi->common).features.allow_screen_content_tools;
        (cpi->sf).tx_sf.inter_tx_size_search_init_depth_sqr = 1;
        (cpi->sf).tx_sf.inter_tx_size_search_init_depth_rect = 1;
        (cpi->sf).tx_sf.intra_tx_size_search_init_depth_rect = 1;
        (cpi->sf).tx_sf.model_based_prune_tx_search_level = 0;
        if (iVar9 < 0x6d && 0x437 < iVar12) {
          (cpi->sf).inter_sf.selective_ref_frame = 2;
          (cpi->sf).rd_sf.tx_domain_dist_level = 2 - (uint)(bVar16 || bVar17);
          uVar14 = 1;
          (cpi->sf).rd_sf.tx_domain_dist_thres_level = 1;
          (cpi->sf).part_sf.simple_motion_search_early_term_none = 1;
          (cpi->sf).tx_sf.tx_type_search.ml_tx_split_thresh = 4000;
          (cpi->sf).interp_sf.cb_pred_filter_search = 0;
          (cpi->sf).tx_sf.tx_type_search.prune_2d_txfm_mode = '\x02';
          lVar8 = 0x60bf0;
          goto LAB_0022ab62;
        }
      }
    }
LAB_0022ab66:
    if (((cpi->oxcf).pass != AOM_RC_FIRST_PASS) && (cpi->compressor_stage != '\x01')) {
      bVar15 = 0x2cf < iVar12;
      iVar9 = (cpi->common).quant_params.base_qindex;
      if (ms_qindex_thresh[speed][bVar15][0] < iVar9) {
        SVar5 = "\x03"[bVar15];
        (cpi->sf).mv_sf.search_method = SVar5;
        (cpi->sf).tpl_sf.search_method = SVar5;
      }
      else if (ms_qindex_thresh[speed][bVar15][1] < iVar9) {
        (cpi->sf).mv_sf.search_method = '\x02';
      }
    }
LAB_0022abec:
    bVar15 = (bVar16 || bVar17) || bVar2 == 6;
  }
  else {
    if (speed < 2) goto LAB_0022ab66;
    iVar9 = 6;
    if ((uint)speed < 6) {
      iVar9 = speed;
    }
    if ((uint)speed < 4) {
      uVar10 = iVar9 - 2;
      iVar9 = 0x46;
      if (uVar10 != 0 || 0x1df < iVar12) {
        iVar9 = (&DAT_00504c90)[uVar10];
      }
      if ((cpi->common).features.allow_screen_content_tools == true) {
        iVar9 = *(int *)(&DAT_00504c80 + (ulong)uVar10 * 4);
      }
      if ((cpi->common).quant_params.base_qindex <= iVar9 && (!bVar16 && !bVar17)) {
        (cpi->sf).part_sf.ext_partition_eval_thresh = BLOCK_128X128;
      }
      if (speed == 2) goto LAB_0022ab66;
      goto LAB_0022abec;
    }
    if (speed == 4) {
      iVar11 = 0x50;
      iVar9 = 0x78;
LAB_0022ae3e:
      if (bVar16 || bVar17) {
        iVar9 = iVar11;
      }
      if ((cpi->common).quant_params.base_qindex <= iVar9 && (bVar3 & 0xfd) != 0) goto LAB_0022ae52;
    }
    else {
      if (((uint)speed < 6 && 0x1df < iVar12) &&
         (((bVar3 & 0xfd) == 0 || 0x2cf < iVar12 ||
          ((cpi->common).features.allow_screen_content_tools == true)))) {
        iVar11 = 100;
        iVar9 = 0xa0;
        goto LAB_0022ae3e;
      }
LAB_0022ae52:
      (cpi->sf).part_sf.ext_partition_eval_thresh = BLOCK_128X128;
    }
    iVar9 = 5;
    if ((uint)speed < 5) {
      iVar9 = speed;
    }
    iVar11 = (cpi->common).quant_params.base_qindex;
    if (((0x1df < iVar12) && (iVar11 <= *(int *)(&DAT_00505020 + (ulong)(iVar9 - 4) * 4))) &&
       (!bVar16 && !bVar17)) {
      (cpi->sf).part_sf.rect_partition_eval_thresh = 3;
    }
    bVar15 = true;
    if ((!bVar16 && !bVar17) && bVar2 != 6) {
      if ((iVar11 <= *(int *)(&DAT_00505028 + (ulong)(0x2cf < iVar12) * 4)) ||
         (*(int *)(&DAT_00505030 + (ulong)(0x2cf < iVar12) * 4) < iVar11)) {
        (cpi->sf).lpf_sf.disable_loop_restoration_luma = 1;
      }
      bVar15 = false;
    }
  }
  if (speed == 5) {
    if ((((bVar3 & 0xfd) != 0) && ((cpi->common).features.allow_screen_content_tools == false)) &&
       ((cpi->common).quant_params.base_qindex <
        *(int *)(&DAT_00505038 + (ulong)(0x1df < iVar12) * 4))) {
      (cpi->sf).tx_sf.tx_type_search.winner_mode_tx_type_pruning = 3;
    }
LAB_0022ac6b:
    if ((((cpi->common).features.allow_screen_content_tools == true) && (iVar12 < 0x1e1)) &&
       ((cpi->common).quant_params.base_qindex < 0x80)) {
      uVar14 = 0;
      lVar8 = 0x609cc;
LAB_0022ac8e:
      *(undefined4 *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar8) = uVar14;
    }
LAB_0022ac92:
    (cpi->sf).lpf_sf.min_lr_unit_size = 0x40;
    (cpi->sf).lpf_sf.max_lr_unit_size = 0x100;
LAB_0022acaa:
    if (0x2cf < iVar12) {
      (cpi->sf).lpf_sf.min_lr_unit_size = (uint)(0x59f < iVar12) * 0x80 + 0x80;
    }
    if (2 < (uint)speed || MVar4 == '\x02') {
      iVar9 = 0x100;
      if (iVar12 < 0x5a0) {
        iVar9 = (uint)(0x60 < (cpi->common).quant_params.base_qindex) * 0x80 + 0x80;
      }
      (cpi->sf).lpf_sf.min_lr_unit_size = iVar9;
      (cpi->sf).lpf_sf.max_lr_unit_size = iVar9;
    }
  }
  else {
    if (speed == 1) {
      if (!(bool)(200 < (cpi->common).quant_params.base_qindex | bVar15)) {
        uVar14 = 1;
        lVar8 = 0x60b24;
        goto LAB_0022ac8e;
      }
      goto LAB_0022ac92;
    }
    if (4 < speed) goto LAB_0022ac6b;
    (cpi->sf).lpf_sf.min_lr_unit_size = 0x40;
    (cpi->sf).lpf_sf.max_lr_unit_size = 0x100;
    if (0 < speed) goto LAB_0022acaa;
  }
  uVar10 = (cpi->oxcf).unit_test_cfg.motion_vector_unit_test;
  (cpi->mv_search_params).find_fractional_mv_step =
       fractional_mv_search[(cpi->sf).mv_sf.subpel_search_method];
  if (uVar10 == 1) {
    pcVar13 = av1_return_max_sub_pixel_mv;
LAB_0022ad4f:
    (cpi->mv_search_params).find_fractional_mv_step = pcVar13;
  }
  else if (uVar10 == 2) {
    pcVar13 = av1_return_min_sub_pixel_mv;
    goto LAB_0022ad4f;
  }
  if (speed - 4U < 0xfffffffd) {
    return;
  }
  if ((cpi->oxcf).enable_low_complexity_decode == 0) {
    return;
  }
  if ((0xee < iVar12 - 0x1e1U) &&
     (bVar1 = (pAVar6->gf_group).update_type[bVar1],
     ((2 < (uint)speed || 5 < bVar1) || iVar12 < 0x2d0) || (~(0x32U >> (bVar1 & 0x1f)) & 1) != 0)) {
    return;
  }
  (cpi->sf).lpf_sf.min_lr_unit_size = 0x80;
  uVar10 = 0x80;
  lVar8 = 0x60c7c;
LAB_0022adbe:
  *(uint *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar8) = uVar10;
  return;
}

Assistant:

void av1_set_speed_features_qindex_dependent(AV1_COMP *cpi, int speed) {
  AV1_COMMON *const cm = &cpi->common;
  SPEED_FEATURES *const sf = &cpi->sf;
  WinnerModeParams *const winner_mode_params = &cpi->winner_mode_params;
  const int boosted = frame_is_boosted(cpi);
  const int is_480p_or_lesser = AOMMIN(cm->width, cm->height) <= 480;
  const int is_480p_or_larger = AOMMIN(cm->width, cm->height) >= 480;
  const int is_720p_or_larger = AOMMIN(cm->width, cm->height) >= 720;
  const int is_1080p_or_larger = AOMMIN(cm->width, cm->height) >= 1080;
  const int is_1440p_or_larger = AOMMIN(cm->width, cm->height) >= 1440;
  const int is_arf2_bwd_type =
      cpi->ppi->gf_group.update_type[cpi->gf_frame_index] == INTNL_ARF_UPDATE;

  if (cpi->oxcf.mode == REALTIME) {
    if (speed >= 6) {
      const int qindex_thresh = boosted ? 190 : (is_720p_or_larger ? 120 : 150);
      sf->part_sf.adjust_var_based_rd_partitioning =
          frame_is_intra_only(cm)
              ? 0
              : cm->quant_params.base_qindex > qindex_thresh;
    }
    return;
  }

  if (speed == 0) {
    // qindex_thresh for resolution < 720p
    const int qindex_thresh = boosted ? 70 : (is_arf2_bwd_type ? 110 : 140);
    if (!is_720p_or_larger && cm->quant_params.base_qindex <= qindex_thresh) {
      sf->part_sf.simple_motion_search_split =
          cm->features.allow_screen_content_tools ? 1 : 2;
      sf->part_sf.simple_motion_search_early_term_none = 1;
      sf->tx_sf.model_based_prune_tx_search_level = 0;
    }

    if (is_720p_or_larger && cm->quant_params.base_qindex <= 128) {
      sf->rd_sf.perform_coeff_opt = 2 + is_1080p_or_larger;
      memcpy(winner_mode_params->coeff_opt_thresholds,
             &coeff_opt_thresholds[sf->rd_sf.perform_coeff_opt],
             sizeof(winner_mode_params->coeff_opt_thresholds));
      sf->part_sf.simple_motion_search_split =
          cm->features.allow_screen_content_tools ? 1 : 2;
      sf->tx_sf.inter_tx_size_search_init_depth_rect = 1;
      sf->tx_sf.inter_tx_size_search_init_depth_sqr = 1;
      sf->tx_sf.intra_tx_size_search_init_depth_rect = 1;
      sf->tx_sf.model_based_prune_tx_search_level = 0;

      if (is_1080p_or_larger && cm->quant_params.base_qindex <= 108) {
        sf->inter_sf.selective_ref_frame = 2;
        sf->rd_sf.tx_domain_dist_level = boosted ? 1 : 2;
        sf->rd_sf.tx_domain_dist_thres_level = 1;
        sf->part_sf.simple_motion_search_early_term_none = 1;
        sf->tx_sf.tx_type_search.ml_tx_split_thresh = 4000;
        sf->interp_sf.cb_pred_filter_search = 0;
        sf->tx_sf.tx_type_search.prune_2d_txfm_mode = TX_TYPE_PRUNE_2;
        sf->tx_sf.tx_type_search.skip_tx_search = 1;
      }
    }
  }

  if (speed >= 2) {
    // Disable extended partitions for lower quantizers
    const int aggr = AOMMIN(4, speed - 2);
    const int qindex_thresh1[4] = { 50, 50, 80, 100 };
    const int qindex_thresh2[4] = { 80, 100, 120, 160 };
    int qindex_thresh;
    if (aggr <= 1) {
      const int qthresh2 =
          (!aggr && !is_480p_or_larger) ? 70 : qindex_thresh2[aggr];
      qindex_thresh = cm->features.allow_screen_content_tools
                          ? qindex_thresh1[aggr]
                          : qthresh2;
      if (cm->quant_params.base_qindex <= qindex_thresh && !boosted)
        sf->part_sf.ext_partition_eval_thresh = BLOCK_128X128;
    } else if (aggr <= 2) {
      qindex_thresh = boosted ? qindex_thresh1[aggr] : qindex_thresh2[aggr];
      if (cm->quant_params.base_qindex <= qindex_thresh &&
          !frame_is_intra_only(cm))
        sf->part_sf.ext_partition_eval_thresh = BLOCK_128X128;
    } else if (aggr <= 3) {
      if (!is_480p_or_larger) {
        sf->part_sf.ext_partition_eval_thresh = BLOCK_128X128;
      } else if (!is_720p_or_larger && !frame_is_intra_only(cm) &&
                 !cm->features.allow_screen_content_tools) {
        sf->part_sf.ext_partition_eval_thresh = BLOCK_128X128;
      } else {
        qindex_thresh = boosted ? qindex_thresh1[aggr] : qindex_thresh2[aggr];
        if (cm->quant_params.base_qindex <= qindex_thresh &&
            !frame_is_intra_only(cm))
          sf->part_sf.ext_partition_eval_thresh = BLOCK_128X128;
      }
    } else {
      sf->part_sf.ext_partition_eval_thresh = BLOCK_128X128;
    }
  }

  if (speed >= 4) {
    // Disable rectangular partitions for lower quantizers
    const int aggr = AOMMIN(1, speed - 4);
    const int qindex_thresh[2] = { 65, 80 };
    int disable_rect_part;
    disable_rect_part = !boosted;
    if (cm->quant_params.base_qindex <= qindex_thresh[aggr] &&
        disable_rect_part && is_480p_or_larger) {
      sf->part_sf.rect_partition_eval_thresh = BLOCK_8X8;
    }
  }

  if (speed <= 2) {
    if (!is_stat_generation_stage(cpi)) {
      // Use faster full-pel motion search for high quantizers.
      // Also use reduced total search range for low resolutions at high
      // quantizers.
      const int aggr = speed;
      const int qindex_thresh1 = ms_qindex_thresh[aggr][is_720p_or_larger][0];
      const int qindex_thresh2 = ms_qindex_thresh[aggr][is_720p_or_larger][1];
      const SEARCH_METHODS search_method =
          motion_search_method[is_720p_or_larger];
      if (cm->quant_params.base_qindex > qindex_thresh1) {
        sf->mv_sf.search_method = search_method;
        sf->tpl_sf.search_method = search_method;
      } else if (cm->quant_params.base_qindex > qindex_thresh2) {
        sf->mv_sf.search_method = NSTEP_8PT;
      }
    }
  }

  if (speed >= 4) {
    // Disable LR search at low and high quantizers and enable only for
    // mid-quantizer range.
    if (!boosted && !is_arf2_bwd_type) {
      const int qindex_low[2] = { 100, 60 };
      const int qindex_high[2] = { 180, 160 };
      if (cm->quant_params.base_qindex <= qindex_low[is_720p_or_larger] ||
          cm->quant_params.base_qindex > qindex_high[is_720p_or_larger]) {
        sf->lpf_sf.disable_loop_restoration_luma = 1;
      }
    }
  }

  if (speed == 1) {
    // Reuse interinter wedge mask search from first search for non-boosted
    // non-internal-arf frames, except at very high quantizers.
    if (cm->quant_params.base_qindex <= 200) {
      if (!boosted && !is_arf2_bwd_type)
        sf->inter_sf.reuse_mask_search_results = 1;
    }
  }

  if (speed == 5) {
    if (!(frame_is_intra_only(&cpi->common) ||
          cm->features.allow_screen_content_tools)) {
      const int qindex[2] = { 256, 128 };
      // Set the sf value as 3 for low resolution and
      // for higher resolutions with low quantizers.
      if (cm->quant_params.base_qindex < qindex[is_480p_or_larger])
        sf->tx_sf.tx_type_search.winner_mode_tx_type_pruning = 3;
    }
  }

  if (speed >= 5) {
    // Disable the sf for low quantizers in case of low resolution screen
    // contents.
    if (cm->features.allow_screen_content_tools &&
        cm->quant_params.base_qindex < 128 && is_480p_or_lesser) {
      sf->part_sf.prune_sub_8x8_partition_level = 0;
    }
  }

  // Loop restoration size search
  // At speed 0, always search all available sizes for the maximum possible gain
  sf->lpf_sf.min_lr_unit_size = RESTORATION_PROC_UNIT_SIZE;
  sf->lpf_sf.max_lr_unit_size = RESTORATION_UNITSIZE_MAX;

  if (speed >= 1) {
    // For large frames, small restoration units are almost never useful,
    // so prune them away
    if (is_1440p_or_larger) {
      sf->lpf_sf.min_lr_unit_size = RESTORATION_UNITSIZE_MAX;
    } else if (is_720p_or_larger) {
      sf->lpf_sf.min_lr_unit_size = RESTORATION_UNITSIZE_MAX >> 1;
    }
  }

  if (speed >= 3 || (cpi->oxcf.mode == ALLINTRA && speed >= 1)) {
    // At this speed, a full search is too expensive. Instead, pick a single
    // size based on size and qindex. Note that, in general, higher quantizers
    // (== lower quality) and larger frames generally want to use larger
    // restoration units.
    int qindex_thresh = 96;
    if (cm->quant_params.base_qindex <= qindex_thresh && !is_1440p_or_larger) {
      sf->lpf_sf.min_lr_unit_size = RESTORATION_UNITSIZE_MAX >> 1;
      sf->lpf_sf.max_lr_unit_size = RESTORATION_UNITSIZE_MAX >> 1;
    } else {
      sf->lpf_sf.min_lr_unit_size = RESTORATION_UNITSIZE_MAX;
      sf->lpf_sf.max_lr_unit_size = RESTORATION_UNITSIZE_MAX;
    }
  }

  set_subpel_search_method(&cpi->mv_search_params,
                           cpi->oxcf.unit_test_cfg.motion_vector_unit_test,
                           sf->mv_sf.subpel_search_method);

  if (cpi->oxcf.enable_low_complexity_decode)
    set_speed_features_lc_dec_qindex_dependent(cpi, sf, speed);
}